

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O3

Namer * __thiscall
LiteScript::Namer::Load
          (Namer *__return_storage_ptr__,Namer *this,istream *stream,Memory *memory,
          offset_in_Memory_to_subr caller)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Memory *pMVar5;
  istream *piVar6;
  Nullable<LiteScript::Variable> local_68;
  Variable local_48;
  Namer *local_38;
  
  piVar6 = stream + caller;
  pMVar5 = memory;
  if (((ulong)memory & 1) != 0) {
    pMVar5 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)piVar6 + -1);
  }
  uVar1 = (*(code *)pMVar5)(piVar6,this);
  Memory::GetVariable(&local_68,(Memory *)stream,uVar1);
  Variable::Variable(&local_48,(Variable *)&local_68);
  Namer(__return_storage_ptr__,&local_48);
  Variable::~Variable(&local_48);
  if (local_68.is_null == false) {
    Variable::~Variable((Variable *)&local_68);
  }
  pMVar5 = memory;
  if (((ulong)memory & 1) != 0) {
    pMVar5 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)piVar6 + -1);
  }
  uVar1 = (*(code *)pMVar5)(piVar6,this);
  Memory::GetVariable(&local_68,(Memory *)stream,uVar1);
  Nullable<LiteScript::Variable>::operator=(&__return_storage_ptr__->current,&local_68);
  if (local_68.is_null == false) {
    Variable::~Variable((Variable *)&local_68);
  }
  uVar1 = std::istream::get();
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  iVar4 = std::istream::get();
  uVar1 = (uVar3 & 0xff) << 0x10 | iVar4 << 0x18 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
  if (uVar1 != 0) {
    uVar2 = 0;
    local_38 = this;
    do {
      pMVar5 = memory;
      if (((ulong)memory & 1) != 0) {
        pMVar5 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)piVar6 + -1);
      }
      uVar3 = (*(code *)pMVar5)(piVar6,local_38);
      Memory::GetVariable(&local_68,(Memory *)stream,uVar3);
      Variable::Variable(&local_48,(Variable *)&local_68);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(&__return_storage_ptr__->heap,&local_48);
      Variable::~Variable(&local_48);
      if (local_68.is_null == false) {
        Variable::~Variable((Variable *)&local_68);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::Namer LiteScript::Namer::Load(std::istream &stream, Memory& memory, unsigned int (Memory::*caller)(std::istream&)) {
    Namer res(memory.GetVariable((memory.*caller)(stream)));
    res.current = memory.GetVariable((memory.*caller)(stream));
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        res.heap.push_back(memory.GetVariable((memory.*caller)(stream)));
    return res;
}